

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

bool __thiscall
cmdline::parser::option_with_value<int>::set(option_with_value<int> *this,string *value)

{
  undefined4 uVar1;
  undefined8 in_RSI;
  long *in_RDI;
  exception *e;
  
  uVar1 = (**(code **)(*in_RDI + 0x60))(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0xb) = uVar1;
  *(undefined1 *)(in_RDI + 10) = 1;
  return true;
}

Assistant:

bool set(const std::string& value) {
            try {
                actual = read(value);
                has = true;
            } catch (const std::exception& e) {
                return false;
            }
            return true;
        }